

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O2

void __thiscall Mustache::Renderer::setError(Renderer *this,QString *error,int pos)

{
  QString *pQVar1;
  
  QString::operator=(&this->m_error,(QString *)error);
  this->m_errorPos = pos;
  if ((this->m_partialStack).super_QList<QString>.d.size != 0) {
    pQVar1 = QStack<QString>::top(&this->m_partialStack);
    QString::operator=(&this->m_errorPartial,(QString *)pQVar1);
    return;
  }
  return;
}

Assistant:

void Renderer::setError(const QString& error, int pos)
{
	Q_ASSERT(!error.isEmpty());
	Q_ASSERT(pos >= 0);

	m_error = error;
	m_errorPos = pos;

	if (!m_partialStack.isEmpty())
	{
		m_errorPartial = m_partialStack.top();
	}
}